

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceStatement
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  FileDescriptorProto *parent;
  bool bVar1;
  int path2;
  ServiceOptions *options;
  MethodDescriptorProto *method;
  undefined1 local_90 [8];
  LocationRecorder location_1;
  undefined1 local_68 [8];
  LocationRecorder location;
  string_view local_40;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *service_location_local;
  ServiceDescriptorProto *service_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)service_location;
  service_location_local = (LocationRecorder *)service;
  service_local = (ServiceDescriptorProto *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,";");
  bVar1 = TryConsumeEndOfDeclaration(this,local_40,(LocationRecorder *)0x0);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&location.location_,"option");
    bVar1 = LookingAt(this,stack0xffffffffffffffb0);
    parent = containing_file_local;
    if (bVar1) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_68,(LocationRecorder *)containing_file_local,3);
      options = ServiceDescriptorProto::mutable_options
                          ((ServiceDescriptorProto *)service_location_local);
      this_local._7_1_ =
           ParseOption(this,&options->super_Message,(LocationRecorder *)local_68,local_30,
                       OPTION_STATEMENT);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_68);
    }
    else {
      path2 = ServiceDescriptorProto::method_size((ServiceDescriptorProto *)service_location_local);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_90,(LocationRecorder *)parent,2,path2);
      method = ServiceDescriptorProto::add_method((ServiceDescriptorProto *)service_location_local);
      this_local._7_1_ = ParseServiceMethod(this,method,(LocationRecorder *)local_90,local_30);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_90);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseServiceStatement(ServiceDescriptorProto* service,
                                   const LocationRecorder& service_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kOptionsFieldNumber);
    return ParseOption(service->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kMethodFieldNumber,
                              service->method_size());
    return ParseServiceMethod(service->add_method(), location, containing_file);
  }
}